

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_impl.c
# Opt level: O2

void plugin_destroy(plugin p)

{
  if (p != (plugin)0x0) {
    if (p->dtor != (_func_void_plugin *)0x0) {
      (*p->dtor)(p);
    }
    plugin_descriptor_destroy(p->descriptor);
    free(p->name);
    free(p);
    return;
  }
  return;
}

Assistant:

void plugin_destroy(plugin p)
{
	if (p != NULL)
	{
		if (p->dtor != NULL)
		{
			p->dtor(p);
		}

		plugin_descriptor_destroy(p->descriptor);

		if (p->name != NULL)
		{
			free(p->name);
		}

		free(p);
	}
}